

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_15::BinaryReaderIR::OnCatchAllExpr(BinaryReaderIR *this)

{
  char *__s;
  Expr *pEVar1;
  _func_int ***ppp_Var2;
  Result RVar3;
  Catch local_a0;
  
  __s = this->filename_;
  local_a0.loc.filename._M_len = strlen(__s);
  local_a0.loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_a0.loc.field_1._8_8_ = 0;
  local_a0.loc.filename._M_str = __s;
  Var::Var(&local_a0.var);
  local_a0.exprs.size_ = 0;
  local_a0.exprs.first_ = (Expr *)0x0;
  local_a0.exprs.last_ = (Expr *)0x0;
  RVar3 = AppendCatch(this,&local_a0);
  pEVar1 = local_a0.exprs.first_;
  while (pEVar1 != (Expr *)0x0) {
    ppp_Var2 = &pEVar1->_vptr_Expr;
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var2)[1])();
  }
  local_a0.exprs.first_ = (Expr *)0x0;
  local_a0.exprs.last_ = (Expr *)0x0;
  local_a0.exprs.size_ = 0;
  Var::~Var(&local_a0.var);
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderIR::OnCatchAllExpr() {
  return AppendCatch(Catch(GetLocation()));
}